

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<wabt::(anonymous_namespace)::Newline,char_const(&)[12],std::__cxx11::string&,char_const(&)[4],wabt::(anonymous_namespace)::Newline>
          (CWriter *this,Newline *t,char (*u) [12],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,char (*args_1) [4]
          ,Newline *args_2)

{
  anon_unknown_0::CWriter::Write();
  anon_unknown_0::CWriter::WriteData((CWriter *)this,"#endif  /* ",0xb);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,*(char **)t,*(size_t *)(t + 8));
  anon_unknown_0::CWriter::WriteData((CWriter *)this," */",3);
  anon_unknown_0::CWriter::Write((CWriter *)this);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }